

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatOrderH.c
# Opt level: O1

int Msat_HeapCheck_rec(Msat_Order_t *p,int i)

{
  double dVar1;
  double *pdVar2;
  int *piVar3;
  int iVar4;
  
  while( true ) {
    if (p->vHeap->nSize <= i) {
      return 1;
    }
    if ((1 < (uint)i) &&
       (pdVar2 = p->pSat->pdActivity, piVar3 = p->vHeap->pArray, dVar1 = pdVar2[piVar3[i]],
       pdVar2 = pdVar2 + piVar3[i >> 1], *pdVar2 <= dVar1 && dVar1 != *pdVar2)) break;
    iVar4 = Msat_HeapCheck_rec(p,i * 2);
    if (iVar4 == 0) {
      return 0;
    }
    i = i * 2 | 1;
  }
  return 0;
}

Assistant:

int Msat_HeapCheck_rec( Msat_Order_t * p, int i )
{
    return i >= HSIZE(p) ||
        (
            ( HPARENT(i) == 0 || !HCOMPARE(p, HHEAP(p, i), HHEAP(p, HPARENT(i))) ) &&

            Msat_HeapCheck_rec( p, HLEFT(i) ) && 
            
            Msat_HeapCheck_rec( p, HRIGHT(i) )
        );
}